

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_context_impl.hpp
# Opt level: O2

IGeneratorsForTest * __thiscall Catch::Context::getGeneratorsForCurrentTest(Context *this)

{
  int iVar1;
  IGeneratorsForTest *pIVar2;
  undefined4 extraout_var;
  string testName;
  string asStack_58 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>
  local_38;
  
  pIVar2 = findGeneratorsForCurrentTest(this);
  if (pIVar2 == (IGeneratorsForTest *)0x0) {
    iVar1 = (*(this->super_IMutableContext).super_IContext._vptr_IContext[2])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
              (asStack_58,(long *)CONCAT44(extraout_var,iVar1));
    pIVar2 = createGeneratorsForTest();
    std::__cxx11::string::string((string *)&local_38,asStack_58);
    local_38.second = pIVar2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::IGeneratorsForTest*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>>
                *)&this->m_generatorsByTestName,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string(asStack_58);
  }
  return pIVar2;
}

Assistant:

IGeneratorsForTest& getGeneratorsForCurrentTest() {
            IGeneratorsForTest* generators = findGeneratorsForCurrentTest();
            if( !generators ) {
                std::string testName = getResultCapture()->getCurrentTestName();
                generators = createGeneratorsForTest();
                m_generatorsByTestName.insert( std::make_pair( testName, generators ) );
            }
            return *generators;
        }